

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O2

void __thiscall
aeron::util::SourcedException::SourcedException
          (SourcedException *this,string *what,string *function,string *file,int line)

{
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  *(undefined ***)this = &PTR__SourcedException_0016ea40;
  std::operator+(&local_80,function," : ");
  std::operator+(&local_60,&local_80,file);
  std::operator+(&local_40,&local_60," : ");
  std::__cxx11::to_string(&local_a0,line);
  std::operator+(&this->m_where,&local_40,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&this->m_what,(string *)what);
  return;
}

Assistant:

SourcedException(const std::string &what, const std::string& function, const std::string& file, const int line) :
        m_where(function + " : " + file + " : " + std::to_string(line)),
        m_what(what)
    {
    }